

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O2

void __thiscall wasm::SimplifyGlobals::foldSingleUses(SimplifyGlobals *this)

{
  pointer puVar1;
  Global *pGVar2;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar3;
  undefined1 auStack_118 [8];
  Folder folder;
  
  folder.super_PostWalker<Folder,_wasm::Visitor<Folder,_void>_>.
  super_Walker<Folder,_wasm::Visitor<Folder,_void>_>.currModule = this->module;
  folder.wasm = (Module *)&this->map;
  auStack_118 = (undefined1  [8])0x0;
  folder.super_PostWalker<Folder,_wasm::Visitor<Folder,_void>_>.
  super_Walker<Folder,_wasm::Visitor<Folder,_void>_>.replacep = (Expression **)0x0;
  folder.super_PostWalker<Folder,_wasm::Visitor<Folder,_void>_>.
  super_Walker<Folder,_wasm::Visitor<Folder,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  folder.super_PostWalker<Folder,_wasm::Visitor<Folder,_void>_>.
  super_Walker<Folder,_wasm::Visitor<Folder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Folder,_wasm::Visitor<Folder,_void>_>::Task,_std::allocator<wasm::Walker<Folder,_wasm::Visitor<Folder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  folder.super_PostWalker<Folder,_wasm::Visitor<Folder,_void>_>.
  super_Walker<Folder,_wasm::Visitor<Folder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Folder,_wasm::Visitor<Folder,_void>_>::Task,_std::allocator<wasm::Walker<Folder,_wasm::Visitor<Folder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  folder.super_PostWalker<Folder,_wasm::Visitor<Folder,_void>_>.
  super_Walker<Folder,_wasm::Visitor<Folder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Folder,_wasm::Visitor<Folder,_void>_>::Task,_std::allocator<wasm::Walker<Folder,_wasm::Visitor<Folder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  folder.super_PostWalker<Folder,_wasm::Visitor<Folder,_void>_>.
  super_Walker<Folder,_wasm::Visitor<Folder,_void>_>.currFunction = (Function *)0x0;
  puVar1 = ((folder.super_PostWalker<Folder,_wasm::Visitor<Folder,_void>_>.
             super_Walker<Folder,_wasm::Visitor<Folder,_void>_>.currModule)->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = ((folder.super_PostWalker<Folder,_wasm::Visitor<Folder,_void>_>.
                  super_Walker<Folder,_wasm::Visitor<Folder,_void>_>.currModule)->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pGVar2 = (puVar3->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (pGVar2->init != (Expression *)0x0) {
      Walker<Folder,_wasm::Visitor<Folder,_void>_>::walk
                ((Walker<Folder,_wasm::Visitor<Folder,_void>_> *)auStack_118,&pGVar2->init);
    }
  }
  std::
  _Vector_base<wasm::Walker<Folder,_wasm::Visitor<Folder,_void>_>::Task,_std::allocator<wasm::Walker<Folder,_wasm::Visitor<Folder,_void>_>::Task>_>
  ::~_Vector_base((_Vector_base<wasm::Walker<Folder,_wasm::Visitor<Folder,_void>_>::Task,_std::allocator<wasm::Walker<Folder,_wasm::Visitor<Folder,_void>_>::Task>_>
                   *)((long)(folder.super_PostWalker<Folder,_wasm::Visitor<Folder,_void>_>.
                             super_Walker<Folder,_wasm::Visitor<Folder,_void>_>.stack.fixed._M_elems
                            + 9) + 8));
  return;
}

Assistant:

void foldSingleUses() {
    struct Folder : public PostWalker<Folder> {
      Module& wasm;
      GlobalInfoMap& infos;

      Folder(Module& wasm, GlobalInfoMap& infos) : wasm(wasm), infos(infos) {}

      void visitGlobalGet(GlobalGet* curr) {
        // If this is a get of a global with a single get and no sets, then we
        // can fold that code into here.
        auto name = curr->name;
        auto& info = infos[name];
        if (info.written == 0 && info.read == 1) {
          auto* global = wasm.getGlobal(name);
          if (global->init) {
            // Copy that global's code. For simplicity we copy it as we have to
            // keep that global valid for the operations that happen after us,
            // even though that global will be removed later (we could remove it
            // here, but it would add more complexity than seems worth it).
            replaceCurrent(ExpressionManipulator::copy(global->init, wasm));

            // Update info for later parts of this pass: we are removing a
            // global.get, which is a read, so now there are 0 reads (we also
            // have 0 writes, so no other work is needed here, but update to
            // avoid confusion when debugging, and for possible future changes).
            info.read = 0;
          }
        }
      }
    };

    Folder folder(*module, map);

    for (auto& global : module->globals) {
      if (global->init) {
        folder.walk(global->init);
      }
    }
  }